

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_surface.cxx
# Opt level: O3

void __thiscall xray_re::xr_surface::xr_surface(xr_surface *this,bool skeletal)

{
  char *pcVar1;
  char cVar2;
  ulong uVar3;
  undefined7 in_register_00000031;
  char *pcVar4;
  
  uVar3 = CONCAT71(in_register_00000031,skeletal) & 0xffffffff;
  this->_vptr_xr_surface = (_func_int **)&PTR__xr_surface_0024b3b0;
  (this->m_name)._M_dataplus._M_p = (pointer)&(this->m_name).field_2;
  (this->m_name)._M_string_length = 0;
  (this->m_name).field_2._M_local_buf[0] = '\0';
  pcVar4 = "default";
  if ((int)CONCAT71(in_register_00000031,skeletal) != 0) {
    pcVar4 = "models\\model";
  }
  (this->m_eshader)._M_dataplus._M_p = (pointer)&(this->m_eshader).field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&this->m_eshader,pcVar4,pcVar4 + uVar3 * 5 + 7);
  (this->m_cshader)._M_dataplus._M_p = (pointer)&(this->m_cshader).field_2;
  pcVar4 = "default";
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->m_cshader,"default","");
  cVar2 = (char)uVar3;
  if (cVar2 != '\0') {
    pcVar4 = "default_object";
  }
  pcVar1 = pcVar4 + 7;
  if (cVar2 != '\0') {
    pcVar1 = pcVar4 + 0xe;
  }
  (this->m_gamemtl)._M_dataplus._M_p = (pointer)&(this->m_gamemtl).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->m_gamemtl,pcVar4,pcVar1);
  (this->m_texture)._M_dataplus._M_p = (pointer)&(this->m_texture).field_2;
  (this->m_texture)._M_string_length = 0;
  (this->m_texture).field_2._M_local_buf[0] = '\0';
  (this->m_vmap)._M_dataplus._M_p = (pointer)&(this->m_vmap).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->m_vmap,"Texture","");
  this->m_flags = 0;
  this->m_fvf = 0x112;
  return;
}

Assistant:

xr_surface::xr_surface(bool skeletal):
	m_eshader(skeletal ? "models\\model" : "default"),
	m_cshader("default"),
	m_gamemtl(skeletal ? "default_object" : "default"),
	m_vmap("Texture"),
	m_flags(0),
	m_fvf(ESURFACE_DEFAULT_FVF) {}